

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_TakeStep_Z(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  N_Vector p_Var1;
  double *pdVar2;
  ulong uVar3;
  int iVar4;
  uint7 uVar6;
  uint7 extraout_var;
  ARKodeButcherTable pAVar5;
  N_Vector *pp_Var7;
  int line;
  char *msgfmt;
  long lVar8;
  uint implicit;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  int do_save;
  undefined8 local_58;
  undefined8 local_50;
  N_Vector *local_48;
  sunrealtype *local_40;
  ARKodeARKStepMem step_mem;
  
  iVar4 = arkStep_AccessStepMem(ark_mem,"arkStep_TakeStep_Z",&step_mem);
  if (iVar4 != 0) {
    return iVar4;
  }
  if ((step_mem->implicit == 0) && (step_mem->mass_type == 0)) {
    *nflagPtr = 0;
  }
  local_40 = dsmPtr;
  if ((step_mem->NLS != (SUNNonlinearSolver)0x0) &&
     (step_mem->NLS->ops->setup != (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0)) {
    p_Var1 = ark_mem->tempv3;
    N_VConst(0,p_Var1);
    iVar4 = SUNNonlinSolSetup(step_mem->NLS,p_Var1,ark_mem);
    if (iVar4 < 0) {
      return -0x1e;
    }
    if (iVar4 != 0) {
      return -0x1f;
    }
  }
  iVar4 = ark_mem->relax_enabled;
  bVar9 = iVar4 == 0;
  uVar6 = (uint7)(uint3)((uint)iVar4 >> 8);
  if (bVar9) {
    if (step_mem->implicit != 0) goto LAB_00123d3d;
    bVar9 = true;
    local_58 = (N_Vector *)((ulong)local_58._4_4_ << 0x20);
LAB_00123dc7:
    local_50 = CONCAT71(uVar6,1);
    lVar8 = 1;
    if (ark_mem->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
      iVar4 = SUNAdjointCheckpointScheme_NeedsSaving
                        (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,0,
                         &do_save);
      if (iVar4 != 0) {
        msgfmt = "SUNAdjointCheckpointScheme_NeedsSaving returned %d";
        line = 0x6cc;
        goto LAB_00123e24;
      }
      if ((do_save != 0) &&
         (iVar4 = SUNAdjointCheckpointScheme_InsertVector
                            (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,0
                             ,ark_mem->ycur), iVar4 != 0)) {
        msgfmt = "SUNAdjointCheckpointScheme_InsertVector returned %d";
        line = 0x6dc;
        goto LAB_00123e24;
      }
    }
    local_48 = (N_Vector *)((ulong)local_48 & 0xffffffff00000000);
  }
  else {
    if (step_mem->implicit == 0) {
      bVar9 = true;
      local_58 = (N_Vector *)((ulong)local_58._4_4_ << 0x20);
      if (step_mem->mass_type != 1) goto LAB_00123dc7;
LAB_00123d85:
      N_VScale(0x3ff0000000000000,ark_mem->yn,*step_mem->z);
      bVar9 = false;
      uVar6 = extraout_var;
      goto LAB_00123dc7;
    }
LAB_00123d3d:
    pdVar2 = *step_mem->Bi->A;
    local_58 = (N_Vector *)
               CONCAT44(local_58._4_4_,
                        (int)CONCAT71((int7)((ulong)pdVar2 >> 8),step_mem->explicit != 0));
    if (ABS(*pdVar2) <= 1e-10) {
      if (iVar4 == 0) {
        bVar9 = true;
        goto LAB_00123dc7;
      }
      goto LAB_00123d85;
    }
    local_48 = (N_Vector *)CONCAT44(local_48._4_4_,(int)CONCAT71(uVar6,1));
    lVar8 = 0;
    local_50 = 0;
  }
  if (step_mem->explicit == 0) {
    bVar10 = true;
  }
  else {
    iVar4 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Be);
    bVar10 = iVar4 != 0;
  }
  if (step_mem->implicit == 0) {
    iVar4 = ark_mem->interp_type;
LAB_00123ef5:
    bVar11 = false;
  }
  else {
    iVar4 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi);
    if (iVar4 == 0) {
      bVar10 = false;
    }
    iVar4 = ark_mem->interp_type;
    if (((step_mem->implicit == 0) || (step_mem->predictor != 0)) || (step_mem->autonomous == 0))
    goto LAB_00123ef5;
    bVar11 = step_mem->mass_type != 2;
  }
  if ((ark_mem->fn_is_current == 0) && ((iVar4 == 0 || (local_50 & 1) != 0) || bVar11 != false)) {
    if ((iVar4 == 0 || (local_50 & 1) != 0) ||
        (byte)(~(byte)local_58 & (byte)local_48 & bVar11) != 0) {
      iVar4 = (*ark_mem->step_fullrhs)
                        (ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,(uint)(ark_mem->initsetup == 0)
                        );
      if (iVar4 != 0) {
        return -8;
      }
      ark_mem->fn_is_current = 1;
    }
    else if (bVar10) {
      N_VScale(0x3ff0000000000000,step_mem->Fi[(long)step_mem->stages + -1],*step_mem->Fi);
    }
    else {
      iVar4 = (*step_mem->fi)(ark_mem->tn,ark_mem->yn,*step_mem->Fi,ark_mem->user_data);
      step_mem->nfi = step_mem->nfi + 1;
      if (iVar4 < 0) {
        return -8;
      }
      if (iVar4 != 0) {
        return -0xb;
      }
    }
  }
  step_mem->fn_implicit = (N_Vector)0x0;
  if (bVar11 != false) {
    if ((char)local_50 == '\0') {
      if (((char)local_58 == '\0') && (step_mem->mass_type != 1)) {
        pp_Var7 = &ark_mem->fn;
      }
      else {
        pp_Var7 = &ark_mem->tempv5;
        N_VScale(0x3ff0000000000000,*step_mem->Fi,ark_mem->tempv5);
      }
    }
    else {
      pp_Var7 = step_mem->Fi;
    }
    step_mem->fn_implicit = *pp_Var7;
  }
  local_48 = &ark_mem->tempv1;
  local_58 = &step_mem->zcor;
  for (; lVar8 < step_mem->stages; lVar8 = lVar8 + 1) {
    step_mem->istage = (int)lVar8;
    if (step_mem->implicit == 0) {
      pAVar5 = step_mem->Be;
      local_50 = (ulong)local_50._4_4_ << 0x20;
      implicit = 0;
      bVar10 = false;
    }
    else {
      pAVar5 = step_mem->Bi;
      bVar10 = 1e-10 < ABS(pAVar5->A[lVar8][lVar8]);
      implicit = (uint)bVar10;
      local_50 = CONCAT44(local_50._4_4_,(uint)(bVar10 && step_mem->deduce_rhs != 0));
    }
    dVar12 = pAVar5->c[lVar8] * ark_mem->h + ark_mem->tn;
    ark_mem->tcur = dVar12;
    if (((step_mem->mass_type == 2) && (step_mem->msetup != (ARKMassSetupFn)0x0)) &&
       (iVar4 = (*step_mem->msetup)(ark_mem,dVar12,ark_mem->tempv1,ark_mem->tempv2,ark_mem->tempv3),
       iVar4 != 0)) {
      return -0xf;
    }
    if (bVar10) {
      iVar4 = arkStep_Predict(ark_mem,(int)lVar8,step_mem->zpred);
      if (iVar4 != 0) {
        return iVar4;
      }
      if (step_mem->stage_predict != (ARKStagePredictFn)0x0) {
        iVar4 = (*step_mem->stage_predict)(ark_mem->tcur,step_mem->zpred,ark_mem->user_data);
        if (iVar4 < 0) {
          return -0x27;
        }
        if (iVar4 != 0) {
          return 5;
        }
      }
    }
    iVar4 = arkStep_StageSetup(ark_mem,implicit);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (bVar10) {
      iVar4 = arkStep_Nls(ark_mem,*nflagPtr);
      *nflagPtr = iVar4;
      if (iVar4 != 0) {
        return 5;
      }
    }
    else {
      if (step_mem->mass_type == 1) {
        iVar4 = (*step_mem->msolve)(ark_mem,step_mem->sdata,step_mem->nlscoef);
        *nflagPtr = iVar4;
        if (iVar4 != 0) {
          return 5;
        }
      }
      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,step_mem->sdata,ark_mem->ycur);
    }
    if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
       (iVar4 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data), iVar4 != 0
       )) {
      return -0x26;
    }
    if (!bVar9) {
      N_VScale(0x3ff0000000000000,ark_mem->ycur,step_mem->z[lVar8]);
    }
    uVar3 = local_50;
    if (ark_mem->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
      iVar4 = SUNAdjointCheckpointScheme_NeedsSaving
                        (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,lVar8
                         ,&do_save);
      if (iVar4 != 0) {
        msgfmt = "SUNAdjointCheckpointScheme_NeedsSaving returned %d";
        line = 0x7f6;
        goto LAB_00123e24;
      }
      if ((do_save != 0) &&
         (iVar4 = SUNAdjointCheckpointScheme_InsertVector
                            (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,
                             lVar8,ark_mem->ycur), iVar4 != 0)) {
        msgfmt = "SUNAdjointCheckpointScheme_InsertVector returned %d";
        line = 0x807;
        goto LAB_00123e24;
      }
    }
    if (step_mem->implicit != 0) {
      if ((char)uVar3 == '\0') {
        iVar4 = (*step_mem->fi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fi[lVar8],ark_mem->user_data);
        step_mem->nfi = step_mem->nfi + 1;
        if (iVar4 < 0) {
          return -8;
        }
        if (iVar4 != 0) {
          return -0xb;
        }
      }
      else {
        pp_Var7 = local_58;
        if ((step_mem->mass_type == 1) &&
           (iVar4 = (*step_mem->mmult)(ark_mem,step_mem->zcor,ark_mem->tempv1), pp_Var7 = local_48,
           iVar4 != 0)) {
          return -0x12;
        }
        N_VLinearSum(1.0 / step_mem->gamma,-1.0 / step_mem->gamma,*pp_Var7,step_mem->sdata,
                     step_mem->Fi[lVar8]);
      }
    }
    if (step_mem->explicit != 0) {
      iVar4 = (*step_mem->fe)(step_mem->Be->c[lVar8] * ark_mem->h + ark_mem->tn,ark_mem->ycur,
                              step_mem->Fe[lVar8],ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      if (iVar4 < 0) {
        return -8;
      }
      if (iVar4 != 0) {
        return -0xb;
      }
    }
    if (step_mem->mass_type == 2) {
      if (step_mem->implicit != 0 && (uVar3 & 1) == 0) {
        iVar4 = (*step_mem->msolve)(ark_mem,step_mem->Fi[lVar8],step_mem->nlscoef);
        *nflagPtr = iVar4;
        if (iVar4 != 0) {
          return 5;
        }
      }
      if (step_mem->explicit != 0) {
        iVar4 = (*step_mem->msolve)(ark_mem,step_mem->Fe[lVar8],step_mem->nlscoef);
        *nflagPtr = iVar4;
        if (iVar4 != 0) {
          return 5;
        }
      }
    }
  }
  if (step_mem->mass_type == 1) {
    iVar4 = arkStep_ComputeSolutions_MassFixed(ark_mem,local_40);
  }
  else {
    iVar4 = arkStep_ComputeSolutions(ark_mem,local_40);
  }
  *nflagPtr = iVar4;
  if (iVar4 < 0) {
    return iVar4;
  }
  if (iVar4 != 0) {
    return 5;
  }
  if (ark_mem->checkpoint_scheme == (SUNAdjointCheckpointScheme)0x0) {
    return 0;
  }
  iVar4 = SUNAdjointCheckpointScheme_NeedsSaving
                    (ark_mem->tn + ark_mem->h,ark_mem->checkpoint_scheme,
                     ark_mem->checkpoint_step_idx,(long)step_mem->Be->stages,&do_save);
  if (iVar4 == 0) {
    if (do_save == 0) {
      return 0;
    }
    iVar4 = SUNAdjointCheckpointScheme_InsertVector
                      (ark_mem->tn + ark_mem->h,ark_mem->checkpoint_scheme,
                       ark_mem->checkpoint_step_idx,(long)step_mem->Be->stages,ark_mem->ycur);
    if (iVar4 == 0) {
      return 0;
    }
    msgfmt = "SUNAdjointCheckpointScheme_NeedsSaving returned %d";
    line = 0x89e;
  }
  else {
    msgfmt = "SUNAdjointCheckpointScheme_NeedsSaving returned %d";
    line = 0x88e;
  }
LAB_00123e24:
  arkProcessError(ark_mem,-0x35,line,"arkStep_TakeStep_Z",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                  ,msgfmt,iVar4);
  return -0x35;
}

Assistant:

int arkStep_TakeStep_Z(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval, is, is_start, mode;
  sunbooleantype implicit_stage;
  sunbooleantype deduce_stage;
  sunbooleantype save_stages;
  sunbooleantype stiffly_accurate;
  sunbooleantype save_fn_for_interp;
  sunbooleantype imex_method;
  sunbooleantype save_fn_for_residual;
  sunbooleantype eval_rhs;
  ARKodeARKStepMem step_mem;
  N_Vector zcor0;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if problem will involve no algebraic solvers, initialize nflagPtr to success */
  if ((!step_mem->implicit) && (step_mem->mass_type == MASS_IDENTITY))
  {
    *nflagPtr = ARK_SUCCESS;
  }

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
  {
    if ((step_mem->NLS)->ops->setup)
    {
      zcor0 = ark_mem->tempv3;
      N_VConst(ZERO,
               zcor0); /* set guess to all 0 (since using predictor-corrector form) */
      retval = SUNNonlinSolSetup(step_mem->NLS, zcor0, ark_mem);

      SUNLogInfoIf(retval != 0, ARK_LOGGER, "setup-nonlinear-solver",
                   "status = failed nonlinear solver setup, retval = %i", retval);

      if (retval < 0) { return (ARK_NLS_SETUP_FAIL); }
      if (retval > 0) { return (ARK_NLS_SETUP_RECVR); }
    }
  }

  /* check if we need to store stage values */
  save_stages = SUNFALSE;
  if (ark_mem->relax_enabled &&
      (step_mem->implicit || step_mem->mass_type == MASS_FIXED))
  {
    save_stages = SUNTRUE;
  }

  /* check for an ImEx method */
  imex_method = step_mem->implicit && step_mem->explicit;

  /* check for implicit method with an explicit first stage */
  implicit_stage = SUNFALSE;
  is_start       = 1;
  if (step_mem->implicit)
  {
    if (SUNRabs(step_mem->Bi->A[0][0]) > TINY)
    {
      implicit_stage = SUNTRUE;
      is_start       = 0;
    }
  }

  /* explicit first stage -- store stage if necessary for relaxation or checkpointing */
  if (is_start == 1)
  {
    if (save_stages) { N_VScale(ONE, ark_mem->yn, step_mem->z[0]); }

    if (ark_mem->checkpoint_scheme)
    {
      sunbooleantype do_save;
      SUNErrCode errcode =
        SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                               ark_mem->checkpoint_step_idx, 0,
                                               ark_mem->tcur, &do_save);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }

      if (do_save)
      {
        errcode =
          SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                  ark_mem->checkpoint_step_idx, 0,
                                                  ark_mem->tcur, ark_mem->ycur);

        if (errcode)
        {
          arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                          __FILE__,
                          "SUNAdjointCheckpointScheme_InsertVector returned %d",
                          errcode);
          return ARK_ADJ_CHECKPOINT_FAIL;
        }
      }
    }
  }

  /* check if the method is Stiffly Accurate (SA) */
  stiffly_accurate = SUNTRUE;
  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* Save f(tn, yn) for Hermite interpolation */
  save_fn_for_interp = ark_mem->interp_type == ARK_INTERP_HERMITE;

  /* For an implicit or ImEx method using the trivial predictor with an
     autonomous problem with an identity or fixed mass matrix, save fi(tn, yn)
     for reuse in the first residual evaluation of each stage solve */
  save_fn_for_residual = step_mem->implicit && step_mem->predictor == 0 &&
                         step_mem->autonomous &&
                         step_mem->mass_type != MASS_TIMEDEP;

  SUNLogInfoIf(is_start == 1, ARK_LOGGER, "begin-stage",
               "stage = %i, implicit = %i, tcur = " SUN_FORMAT_G, 0,
               implicit_stage, ark_mem->tcur);
  SUNLogExtraDebugVecIf(is_start == 1, ARK_LOGGER, "explicit stage",
                        ark_mem->yn, "z_0(:) =");

  /* Call the RHS if needed. */
  eval_rhs = !implicit_stage || save_fn_for_interp || save_fn_for_residual;

  if (!(ark_mem->fn_is_current) && eval_rhs)
  {
    /* If saving the RHS evaluation for reuse in the residual, call the full RHS
       for all implicit methods or for ImEx methods with an explicit first
       stage. ImEx methods with an implicit first stage may not need to evaluate
       fe depending on the interpolation type (covered by save_fn_for_interp) */
    sunbooleantype res_full_rhs = save_fn_for_residual && implicit_stage &&
                                  !imex_method;

    if (!implicit_stage || save_fn_for_interp || res_full_rhs)
    {
      /* Need full RHS evaluation. If this is the first step, then we evaluate
         or copy the RHS values from an earlier evaluation (e.g., to compute
         h0). For subsequent steps treat this call as an evaluation at the end
         of the just completed step (tn, yn) and potentially reuse the
         evaluation (FSAL method) or save the value for later use. */
      mode   = (ark_mem->initsetup) ? ARK_FULLRHS_START : ARK_FULLRHS_END;
      retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                     ark_mem->fn, mode);
      if (retval)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed full rhs eval, retval = %i", retval);
        return ARK_RHSFUNC_FAIL;
      }
      ark_mem->fn_is_current = SUNTRUE;
    }
    else
    {
      /* For an ImEx method with implicit first stage and an interpolation
         method that does not need fn (e.g., Lagrange), only evaluate fi (if
         necessary) for reuse in the residual */
      if (stiffly_accurate)
      {
        N_VScale(ONE, step_mem->Fi[step_mem->stages - 1], step_mem->Fi[0]);
      }
      else
      {
        retval = step_mem->fi(ark_mem->tn, ark_mem->yn, step_mem->Fi[0],
                              ark_mem->user_data);
        step_mem->nfi++;

        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed implicit rhs eval, retval = %i", retval);

        if (retval < 0) { return ARK_RHSFUNC_FAIL; }
        if (retval > 0) { return ARK_UNREC_RHSFUNC_ERR; }
      }
    }
  }

  /* Set alias to implicit RHS evaluation for reuse in residual */
  step_mem->fn_implicit = NULL;
  if (save_fn_for_residual)
  {
    if (!implicit_stage)
    {
      /* Explicit first stage -- Fi[0] will be retained */
      step_mem->fn_implicit = step_mem->Fi[0];
    }
    else
    {
      /* Implicit first stage -- Fi[0] will be overwritten */
      if (imex_method || step_mem->mass_type == MASS_FIXED)
      {
        /* Copy from Fi[0] as fn includes fe or M^{-1} */
        N_VScale(ONE, step_mem->Fi[0], ark_mem->tempv5);
        step_mem->fn_implicit = ark_mem->tempv5;
      }
      else
      {
        /* fn is the same as Fi[0] but will not be overwritten */
        step_mem->fn_implicit = ark_mem->fn;
      }
    }
  }

  SUNLogExtraDebugVecIf(is_start == 1 && step_mem->implicit, ARK_LOGGER,
                        "implicit RHS", step_mem->Fi[0], "Fi_0(:) =");
  SUNLogExtraDebugVecIf(is_start == 1 && step_mem->explicit, ARK_LOGGER,
                        "explicit RHS", step_mem->Fe[0], "Fe_0(:) =");
  SUNLogInfoIf(is_start == 1, ARK_LOGGER, "end-stage", "status = success");

  /* loop over internal stages to the step */
  for (is = is_start; is < step_mem->stages; is++)
  {
    /* store current stage index */
    step_mem->istage = is;

    /* determine whether implicit solve is required */
    implicit_stage = SUNFALSE;
    if (step_mem->implicit)
    {
      if (SUNRabs(step_mem->Bi->A[is][is]) > TINY) { implicit_stage = SUNTRUE; }
    }

    /* determine if the stage RHS will be deduced from the implicit solve */
    deduce_stage = step_mem->deduce_rhs && implicit_stage;

    /* set current stage time(s) */
    if (step_mem->implicit)
    {
      ark_mem->tcur = ark_mem->tn + step_mem->Bi->c[is] * ark_mem->h;
    }
    else { ark_mem->tcur = ark_mem->tn + step_mem->Be->c[is] * ark_mem->h; }

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, implicit = %i, tcur = " SUN_FORMAT_G, is,
               implicit_stage, ark_mem->tcur);

    /* setup time-dependent mass matrix */
    if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL))
    {
      retval = step_mem->msetup((void*)ark_mem, ark_mem->tcur, ark_mem->tempv1,
                                ark_mem->tempv2, ark_mem->tempv3);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed mass setup, retval = %i", retval);
        return (ARK_MASSSETUP_FAIL);
      }
    }

    /* if implicit, call built-in and user-supplied predictors
       (results placed in zpred) */
    if (implicit_stage)
    {
      retval = arkStep_Predict(ark_mem, is, step_mem->zpred);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed predict, retval = %i", retval);
        return (retval);
      }

      /* if a user-supplied predictor routine is provided, call that here.
         Note that arkStep_Predict is *still* called, so this user-supplied
         routine can just 'clean up' the built-in prediction, if desired. */
      if (step_mem->stage_predict)
      {
        retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                         ark_mem->user_data);

        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
        if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
        if (retval > 0) { return (TRY_AGAIN); }
      }

      SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred, "zpred(:) =");
    }

    /* set up explicit data for evaluation of ARK stage (store in sdata) */
    retval = arkStep_StageSetup(ark_mem, implicit_stage);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed stage setup, retval = %i", retval);
      return (retval);
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata, "sdata(:) =");

    /* perform implicit solve if required */
    if (implicit_stage)
    {
      /* implicit solve result is stored in ark_mem->ycur;
         return with positive value on anything but success */
      *nflagPtr = arkStep_Nls(ark_mem, *nflagPtr);
      if (*nflagPtr != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage", "status = failed solve, nflag = %i",
                   *nflagPtr);
        return (TRY_AGAIN);
      }

      SUNLogExtraDebugVec(ARK_LOGGER, "implicit stage", ark_mem->ycur,
                          "z_%i(:) =", is);

      /* otherwise no implicit solve is needed */
    }
    else
    {
      /* if M is fixed, solve with it to compute update (place back in sdata) */
      if (step_mem->mass_type == MASS_FIXED)
      {
        /* perform solve; return with positive value on anything but success */
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->sdata,
                                     step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }

      /* set y to be yn + sdata (either computed in arkStep_StageSetup,
         or updated in prev. block) */
      N_VLinearSum(ONE, ark_mem->yn, ONE, step_mem->sdata, ark_mem->ycur);

      SUNLogExtraDebugVec(ARK_LOGGER, "explicit stage", ark_mem->ycur,
                          "z_%i(:) =", is);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    /* NOTE: with internally inconsistent IMEX methods (c_i^E != c_i^I) the value
       of tcur corresponds to the stage time from the implicit table (c_i^I). */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
    }

    /* successful stage solve */

    /*    store stage (if necessary for relaxation) */
    if (save_stages) { N_VScale(ONE, ark_mem->ycur, step_mem->z[is]); }

    /*    checkpoint stage for adjoint (if necessary) */
    if (ark_mem->checkpoint_scheme)
    {
      sunbooleantype do_save;
      SUNErrCode errcode =
        SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                               ark_mem->checkpoint_step_idx, is,
                                               ark_mem->tcur, &do_save);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }

      if (do_save)
      {
        errcode =
          SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                  ark_mem->checkpoint_step_idx,
                                                  is, ark_mem->tcur,
                                                  ark_mem->ycur);

        if (errcode)
        {
          arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                          __FILE__,
                          "SUNAdjointCheckpointScheme_InsertVector returned %d",
                          errcode);
          return ARK_ADJ_CHECKPOINT_FAIL;
        }
      }
    }

    /*    store implicit RHS (value in Fi[is] is from preceding nonlinear iteration) */
    if (step_mem->implicit)
    {
      if (!deduce_stage)
      {
        retval = step_mem->fi(ark_mem->tcur, ark_mem->ycur, step_mem->Fi[is],
                              ark_mem->user_data);
        step_mem->nfi++;

        SUNLogExtraDebugVec(ARK_LOGGER, "implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed implicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }
      }
      else
      {
        if (step_mem->mass_type == MASS_FIXED)
        {
          retval = step_mem->mmult((void*)ark_mem, step_mem->zcor,
                                   ark_mem->tempv1);
          if (retval != ARK_SUCCESS)
          {
            SUNLogInfo(ARK_LOGGER, "end-stage",
                       "status = failed mass mult, retval = %i", retval);
            return (ARK_MASSMULT_FAIL);
          }

          N_VLinearSum(ONE / step_mem->gamma, ark_mem->tempv1,
                       -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);
      }
    }

    /*    store explicit RHS */
    if (step_mem->explicit)
    {
      retval = step_mem->fe(ark_mem->tn + step_mem->Be->c[is] * ark_mem->h,
                            ark_mem->ycur, step_mem->Fe[is], ark_mem->user_data);
      step_mem->nfe++;

      SUNLogExtraDebugVec(ARK_LOGGER, "explicit RHS", step_mem->Fe[is],
                          "Fe_%i(:) =", is);
      SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                   "status = failed explicit rhs eval, retval = %i", retval);

      if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
      if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }
    }

    /* if using a time-dependent mass matrix, update Fe[is] and/or Fi[is] with M(t)^{-1} */
    if (step_mem->mass_type == MASS_TIMEDEP)
    {
      /* If the implicit stage was deduced, it already includes M(t)^{-1} */
      if (step_mem->implicit && !deduce_stage)
      {
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->Fi[is],
                                     step_mem->nlscoef);

        SUNLogExtraDebugVec(ARK_LOGGER, "M^{-1} implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);

        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      if (step_mem->explicit)
      {
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->Fe[is],
                                     step_mem->nlscoef);
        SUNLogExtraDebugVec(ARK_LOGGER, "M^{-1} explicit RHS", step_mem->Fe[is],
                            "Fe_%i(:) =", is);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
    }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  SUNLogInfo(ARK_LOGGER, "begin-compute-solution", "mass type = %i",
             step_mem->mass_type);

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm).
     This can fail recoverably due to nonconvergence of the mass matrix solve,
     so handle that appropriately. */
  if (step_mem->mass_type == MASS_FIXED)
  {
    *nflagPtr = arkStep_ComputeSolutions_MassFixed(ark_mem, dsmPtr);
  }
  else { *nflagPtr = arkStep_ComputeSolutions(ark_mem, dsmPtr); }

  SUNLogInfoIf(*nflagPtr != ARK_SUCCESS, ARK_LOGGER, "end-compute-solution",
               "status = failed compute solution, retval = %i", *nflagPtr);

  if (*nflagPtr < 0) { return (*nflagPtr); }
  if (*nflagPtr > 0) { return (TRY_AGAIN); }

  if (ark_mem->checkpoint_scheme)
  {
    sunbooleantype do_save;
    SUNErrCode errcode =
      SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                             ark_mem->checkpoint_step_idx,
                                             step_mem->Be->stages,
                                             ark_mem->tn + ark_mem->h, &do_save);
    if (errcode)
    {
      arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                      __FILE__,
                      "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                      errcode);
      return ARK_ADJ_CHECKPOINT_FAIL;
    }
    if (do_save)
    {
      errcode =
        SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                ark_mem->checkpoint_step_idx,
                                                step_mem->Be->stages,
                                                ark_mem->tn + ark_mem->h,
                                                ark_mem->ycur);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }
    }
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "end-compute-solution", "status = success");

  return (ARK_SUCCESS);
}